

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O1

Tree flutes_c(int d,int *xs,int *ys,int *s,int acc)

{
  int *piVar1;
  dl_t paVar2;
  dl_el *pdVar3;
  bool bVar4;
  int iVar5;
  dl_el_s **ppdVar6;
  int iVar7;
  dl_el *pdVar8;
  dl_el_s *pdVar9;
  dl_el_s *pdVar10;
  long lVar11;
  Branch *pBVar12;
  dl_el *pdVar13;
  ulong uVar14;
  Branch *unaff_R12;
  Tree TVar15;
  dl_el_s *local_48;
  
  pBVar12 = (Branch *)(long)d;
  pdVar3 = ht[(long)pBVar12]->first;
  do {
    pdVar13 = pdVar3;
    if (pdVar13 == (dl_el *)0x0) goto LAB_00126849;
    pdVar9 = pdVar13[1].next;
    pdVar8 = ht[(long)pBVar12]->first;
    if (d < 1) break;
    bVar4 = 0 < d;
    pdVar8 = pdVar13;
    if (*(int *)((long)&pdVar9->prev + 4) == *ys) {
      pdVar10 = pdVar9 + 1;
      uVar14 = 1;
      do {
        if (*(int *)&pdVar10[-1].prev != xs[s[uVar14 - 1]]) break;
        if ((uint)d == uVar14) goto LAB_001267e6;
        bVar4 = (long)uVar14 < (long)pBVar12;
        ppdVar6 = &pdVar10->prev;
        pdVar10 = (dl_el_s *)((long)&pdVar10->next + 4);
        piVar1 = ys + uVar14;
        uVar14 = uVar14 + 1;
      } while (*(int *)ppdVar6 == *piVar1);
    }
    pdVar3 = pdVar13->next;
    unaff_R12 = pBVar12;
  } while (bVar4);
LAB_001267e6:
  local_48 = pdVar8[1].prev;
  iVar5 = d * 2;
  unaff_R12 = (Branch *)malloc((long)iVar5 * 0xc - 0x18);
  if (1 < d) {
    iVar7 = iVar5 + -2;
    lVar11 = (ulong)(iVar5 - 4) * 0xc + 0xc;
    do {
      *(undefined4 *)((long)&unaff_R12->n + lVar11) = *(undefined4 *)((long)&pdVar9->next + lVar11);
      *(undefined8 *)((long)&unaff_R12->x + lVar11) = *(undefined8 *)((long)&pdVar9->prev + lVar11);
      iVar7 = iVar7 + -1;
      lVar11 = lVar11 + -0xc;
    } while (0 < iVar7);
  }
LAB_00126849:
  TVar15.branch = unaff_R12;
  TVar15._0_8_ = local_48;
  if (pdVar13 == (dl_el *)0x0) {
    if (d < 10) {
      TVar15 = flutes_LD(d,xs,ys,s);
    }
    else {
      TVar15 = flutes_MD(d,xs,ys,s,acc);
    }
    iVar5 = d * 2;
    pdVar9 = (dl_el_s *)malloc((long)iVar5 * 0xc - 0x18);
    if (1 < d) {
      iVar7 = iVar5 + -2;
      lVar11 = (ulong)(iVar5 - 4) * 0xc + 0xc;
      do {
        *(undefined4 *)((long)&pdVar9->next + lVar11) =
             *(undefined4 *)((long)&(TVar15.branch)->n + lVar11);
        *(undefined8 *)((long)&pdVar9->prev + lVar11) =
             *(undefined8 *)((long)&(TVar15.branch)->x + lVar11);
        iVar7 = iVar7 + -1;
        lVar11 = lVar11 + -0xc;
      } while (0 < iVar7);
    }
    pdVar10 = (dl_el_s *)malloc(0x20);
    if (pdVar10 == (dl_el_s *)0x0) {
      puts("Out of memory!!");
    }
    else {
      pdVar10[1].prev = TVar15._0_8_;
      pdVar10[1].next = pdVar9;
      pdVar10->prev = (dl_el_s *)0x0;
      paVar2 = ht[(long)pBVar12];
      if (paVar2->count == 0) {
        pdVar10->next = (dl_el_s *)0x0;
        paVar2->last = pdVar10;
        ht[(long)pBVar12]->first = pdVar10;
        ht[(long)pBVar12]->count = 1;
      }
      else {
        pdVar3 = paVar2->first;
        pdVar10->next = pdVar3;
        pdVar3->prev = pdVar10;
        ht[(long)pBVar12]->first = pdVar10;
        ht[(long)pBVar12]->count = ht[(long)pBVar12]->count + 1;
      }
    }
  }
  return TVar15;
}

Assistant:

Tree flutes_c(int d, DTYPE *xs, DTYPE *ys, int *s, int acc)
{
  int i;
  //int orig_ht_flag;
  Tree t, tdup;

#if USE_HASHING
  dl_forall(Tree, ht[d], t) {
    for (i=0; i<d; i++) {
      if (t.branch[i].y != ys[i] || t.branch[i].x != xs[s[i]]) {
	break;
      }
    }
    if (i >= d) { // found a match
      tdup = t;
      tdup.branch = (Branch*)malloc(sizeof(Branch)*(2*d-2));
      for (i=2*d-3; i>=0; i--) {
	tdup.branch[i] = t.branch[i];
      }
      return tdup;
    }
  } dl_endfor;

  //orig_ht_flag = new_ht;
  //new_ht = 0;
#endif

  t = flutes_LMD(d, xs, ys, s, acc);

#if USE_HASHING
  //new_ht = orig_ht_flag;
      
  tdup = t;
  tdup.branch = (Branch*)malloc(sizeof(Branch)*(2*d-2));
  for (i=2*d-3; i>=0; i--) {
    tdup.branch[i] = t.branch[i];
  }
  dl_prepend(Tree, ht[d], tdup);
#endif  

  return t;
}